

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void blankingTime(void)

{
  undefined4 local_18;
  undefined4 local_14;
  int i_3;
  int i_2;
  int i_1;
  int i;
  
  for (i_2 = 0; i_2 < 0x50; i_2 = i_2 + 1) {
    putchar(0xd);
  }
  for (i_3 = 0; i_3 < 2; i_3 = i_3 + 1) {
    putchar(0xd);
  }
  for (local_14 = 0; local_14 < 0xc; local_14 = local_14 + 1) {
    putchar(9);
  }
  for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
    putchar(0xd);
  }
  return;
}

Assistant:

void blankingTime() {

    // Blanking
    for(int i=0;i<(640/8);i++) {
        putchar(0b00001101);
    }

    // Front Porch
    for(int i=0; i<(16/8); i++) {
        putchar(0b00001101);
    }

    // hSync
    for(int i=0;i<(96/8);i++) {
        putchar(0b00001001);
    }

    // Back Porch
    for(int i=0; i<(48/8); i++) {
        putchar(0b00001101);
    }

}